

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  double dVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  float *__src;
  ImGuiTableColumn *pIVar6;
  float fVar7;
  uint uVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ImPoolIdx IVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ImU32 IVar15;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  undefined4 extraout_var;
  ImGuiTableTempData *__dest;
  ImGuiTableTempData *pIVar16;
  ImDrawListSplitter *pIVar17;
  float *__dest_00;
  ImGuiTableColumn *pIVar18;
  char *pcVar19;
  ImGuiTableColumn *pIVar20;
  char *__dest_01;
  uint uVar21;
  ImRect *pIVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  ImGuiWindow *pIVar26;
  ulong uVar27;
  size_t size;
  long lVar28;
  ImGuiTableColumnFlags *pIVar29;
  ImGuiID id_00;
  int iVar30;
  long lVar31;
  ImGuiContext *g;
  byte bVar32;
  float fVar33;
  undefined4 in_XMM0_Db;
  ImVec2 IVar34;
  ImVec2 IVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  ImRect outer_rect;
  void *local_128;
  ImRect local_118;
  undefined8 local_108;
  uint local_fc;
  undefined8 local_f8;
  char *local_e0;
  ulong local_d8;
  ImVec2 *local_d0;
  ImVec2 local_c8;
  undefined8 uStack_c0;
  ImDrawListSplitter local_b8;
  undefined3 uStack_a0;
  undefined5 uStack_9d;
  undefined3 uStack_98;
  undefined8 uStack_95;
  void *local_88;
  
  pIVar9 = GImGui;
  bVar32 = 0;
  local_f8 = (ImGuiWindow *)CONCAT44(in_XMM0_Db,inner_width);
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems != false) {
    return false;
  }
  uVar23 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x143,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x145,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar34 = GetContentRegionAvail();
  fVar36 = IVar34.x;
  fVar38 = IVar34.y;
  if (fVar36 <= 1.0) {
    fVar36 = 1.0;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar34 = CalcItemSize(*outer_size,fVar36,0.0);
    local_118.Min = (pIVar4->DC).CursorPos;
    local_118.Max.y = IVar34.y + (pIVar4->DC).CursorPos.y;
    local_118.Max.x = (pIVar4->DC).CursorPos.x + IVar34.x;
  }
  else {
    if (fVar38 <= 1.0) {
      fVar38 = 1.0;
    }
    IVar34 = CalcItemSize(*outer_size,fVar36,fVar38);
    local_118.Min = (pIVar4->DC).CursorPos;
    local_118.Max.y = IVar34.y + (pIVar4->DC).CursorPos.y;
    local_118.Max.x = (pIVar4->DC).CursorPos.x + IVar34.x;
    bVar10 = IsClippedEx(&local_118,0,false);
    if (bVar10) {
      ItemSize(&local_118,-1.0);
      return false;
    }
  }
  local_e0 = name;
  local_d0 = outer_size;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar9->Tables,id);
  local_d8 = 0;
  if (p_00->LastFrameActive == pIVar9->FrameCount) {
    local_d8 = (ulong)((int)p_00->InstanceCurrent + 1);
  }
  uVar21 = p_00->Flags;
  local_fc = flags;
  if ((0 < (int)local_d8) && (p_00->ColumnsCount != columns_count)) {
    __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x158,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar11 = ImPool<ImGuiTable>::GetIndex(&pIVar9->Tables,p_00);
  local_108 = CONCAT44(extraout_var,IVar11);
  iVar25 = pIVar9->CurrentTableStackIdx;
  pIVar9->CurrentTableStackIdx = iVar25 + 1;
  iVar12 = iVar25 + 2;
  if ((pIVar9->TablesTempDataStack).Size < iVar12) {
    memset(&local_c8,0,0x90);
    local_c8.y = -1.0;
    iVar30 = (pIVar9->TablesTempDataStack).Capacity;
    if (iVar30 < iVar12) {
      if (iVar30 == 0) {
        iVar24 = 8;
      }
      else {
        iVar24 = iVar30 / 2 + iVar30;
      }
      if (iVar24 <= iVar12) {
        iVar24 = iVar12;
      }
      if (iVar30 < iVar24) {
        __dest = (ImGuiTableTempData *)MemAlloc((long)iVar24 * 0x90);
        pIVar16 = (pIVar9->TablesTempDataStack).Data;
        if (pIVar16 != (ImGuiTableTempData *)0x0) {
          memcpy(__dest,pIVar16,(long)(pIVar9->TablesTempDataStack).Size * 0x90);
          MemFree((pIVar9->TablesTempDataStack).Data);
        }
        (pIVar9->TablesTempDataStack).Data = __dest;
        (pIVar9->TablesTempDataStack).Capacity = iVar24;
      }
    }
    iVar30 = (pIVar9->TablesTempDataStack).Size;
    if (iVar30 < iVar12) {
      lVar28 = ((long)iVar25 - (long)iVar30) + 2;
      lVar31 = (long)iVar30 * 0x90;
      do {
        memcpy((void *)((long)&((pIVar9->TablesTempDataStack).Data)->TableIndex + lVar31),&local_c8,
               0x90);
        lVar31 = lVar31 + 0x90;
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
    }
    (pIVar9->TablesTempDataStack).Size = iVar12;
    if (local_88 != (void *)0x0) {
      MemFree(local_88);
    }
    ImDrawListSplitter::ClearFreeMemory(&local_b8);
    if (local_b8._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_b8._Channels.Data);
    }
  }
  lVar31 = (long)pIVar9->CurrentTableStackIdx;
  if ((lVar31 < 0) || ((pIVar9->TablesTempDataStack).Size <= pIVar9->CurrentTableStackIdx)) {
    pcVar19 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
  }
  else {
    pIVar16 = (pIVar9->TablesTempDataStack).Data;
    pIVar26 = (ImGuiWindow *)(pIVar16 + lVar31);
    p_00->TempData = (ImGuiTableTempData *)pIVar26;
    pIVar16 = pIVar16 + lVar31;
    pIVar17 = &pIVar16->DrawSplitter;
    pIVar16->TableIndex = (int)local_108;
    p_00->DrawSplitter = pIVar17;
    pIVar17->_Current = 0;
    pIVar17->_Count = 1;
    bVar10 = (local_fc & 0xe000) == 0;
    p_00->IsDefaultSizingPolicy = bVar10;
    uVar13 = local_fc;
    if (bVar10) {
      uVar13 = 0x2000;
      if (((local_fc >> 0x18 & 1) == 0) && (uVar13 = 0x2000, (pIVar4->Flags & 0x40) == 0)) {
        uVar13 = 0x8000;
      }
      uVar13 = uVar13 | local_fc;
    }
    uVar14 = uVar13 | 0x40000;
    if ((uVar13 & 0xe000) != 0x4000) {
      uVar14 = uVar13;
    }
    uVar13 = uVar14 & 0xfffcffff;
    if ((uVar14 & 0x3000000) == 0) {
      uVar13 = uVar14;
    }
    uVar8 = uVar13 & 0xfffff7ff;
    if ((uVar13 >> 0xc & 1) == 0) {
      uVar8 = uVar13;
    }
    uVar13 = (uVar14 & 1) << 9 | uVar8;
    uVar14 = uVar13 | 0x10;
    if ((uVar8 & 0xf) == 0) {
      uVar13 = uVar14;
    }
    id_00 = (int)local_d8 + id;
    if (((uint)pIVar4->RootWindow->Flags >> 8 & 1) != 0) {
      uVar13 = uVar14;
    }
    p_00->ID = id;
    p_00->Flags = uVar13;
    p_00->InstanceCurrent = (ImS16)local_d8;
    p_00->LastFrameActive = pIVar9->FrameCount;
    p_00->InnerWindow = pIVar4;
    p_00->OuterWindow = pIVar4;
    p_00->ColumnsCount = columns_count;
    p_00->IsLayoutLocked = false;
    p_00->InnerWidth = (float)local_f8;
    fVar36 = local_d0->y;
    pIVar26->ID = (ImGuiID)local_d0->x;
    pIVar26->Flags = (ImGuiWindowFlags)fVar36;
    if ((local_fc & 0x3000000) == 0) {
      (p_00->InnerRect).Min = local_118.Min;
      (p_00->InnerRect).Max = local_118.Max;
      (p_00->OuterRect).Min = local_118.Min;
      (p_00->OuterRect).Max = local_118.Max;
      (p_00->WorkRect).Min = local_118.Min;
      (p_00->WorkRect).Max = local_118.Max;
    }
    else {
      fVar36 = (float)local_f8;
      if ((uVar13 & 0x1000000) == 0) {
        fVar36 = 3.4028235e+38;
      }
      fVar36 = (float)(~-(uint)(0.0 < (float)local_f8) & 0x7f7fffff |
                      (uint)fVar36 & -(uint)(0.0 < (float)local_f8));
      if (fVar36 != 3.4028235e+38 || (uVar13 & 0x3000000) == 0x1000000) {
        if ((uVar13 & 0x3000000) == 0x1000000) {
          local_c8.y = 1.1754944e-38;
        }
        else {
          local_c8.y = 0.0;
        }
        local_c8.x = (float)(-(uint)(fVar36 != 3.4028235e+38) & (uint)fVar36);
        SetNextWindowContentSize(&local_c8);
      }
      local_f8 = pIVar26;
      if ((uVar21 & 0x3000000) == 0) {
        local_c8.x = 0.0;
        local_c8.y = 0.0;
        SetNextWindowScroll(&local_c8);
      }
      local_c8.x = local_118.Max.x - local_118.Min.x;
      local_c8.y = local_118.Max.y - local_118.Min.y;
      BeginChildEx(local_e0,id_00,&local_c8,false,(uVar13 & 0x1000000) >> 0xd);
      pIVar5 = pIVar9->CurrentWindow;
      p_00->InnerWindow = pIVar5;
      IVar34 = (pIVar5->WorkRect).Max;
      (p_00->WorkRect).Min = (pIVar5->WorkRect).Min;
      (p_00->WorkRect).Max = IVar34;
      fVar36 = (pIVar5->Pos).x;
      fVar38 = (pIVar5->Pos).y;
      fVar33 = (pIVar5->Size).x;
      fVar37 = (pIVar5->Size).y;
      fVar7 = (pIVar5->Pos).y;
      (p_00->OuterRect).Min.x = (pIVar5->Pos).x;
      (p_00->OuterRect).Min.y = fVar7;
      (p_00->OuterRect).Max.x = fVar36 + fVar33;
      (p_00->OuterRect).Max.y = fVar38 + fVar37;
      IVar34 = (pIVar5->InnerRect).Max;
      (p_00->InnerRect).Min = (pIVar5->InnerRect).Min;
      (p_00->InnerRect).Max = IVar34;
      if (((((pIVar5->WindowPadding).x != 0.0) ||
           (fVar36 = (pIVar5->WindowPadding).y, fVar36 != 0.0)) || (NAN(fVar36))) ||
         ((pIVar5->WindowBorderSize != 0.0 || (pIVar26 = local_f8, NAN(pIVar5->WindowBorderSize)))))
      {
        __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                      ,0x191,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
    PushOverrideID(id_00);
    pIVar5 = p_00->InnerWindow;
    p_00->HostIndentX = (pIVar5->DC).Indent.x;
    IVar34 = (pIVar5->ClipRect).Max;
    (p_00->HostClipRect).Min = (pIVar5->ClipRect).Min;
    (p_00->HostClipRect).Max = IVar34;
    p_00->HostSkipItems = pIVar5->SkipItems;
    fVar36 = (pIVar5->WorkRect).Min.y;
    fVar38 = (pIVar5->WorkRect).Max.x;
    fVar33 = (pIVar5->WorkRect).Max.y;
    pIVar26->WindowRounding = (pIVar5->WorkRect).Min.x;
    pIVar26->WindowBorderSize = fVar36;
    pIVar26->NameBufLen = (int)fVar38;
    pIVar26->MoveId = (ImGuiID)fVar33;
    fVar36 = (pIVar5->ParentWorkRect).Min.y;
    IVar34 = (pIVar5->ParentWorkRect).Max;
    pIVar26->ChildId = (ImGuiID)(pIVar5->ParentWorkRect).Min.x;
    (pIVar26->Scroll).x = fVar36;
    *(ImVec2 *)&(pIVar26->Scroll).y = IVar34;
    (pIVar26->ScrollTargetEdgeSnapDist).y = (pIVar4->DC).ColumnsOffset.x;
    *(ImVec2 *)&(pIVar26->ScrollMax).y = (pIVar5->DC).PrevLineSize;
    *(ImVec2 *)&(pIVar26->ScrollTarget).y = (pIVar5->DC).CurrLineSize;
    *(ImVec2 *)&(pIVar26->ScrollTargetCenterRatio).y = (pIVar5->DC).CursorMaxPos;
    (pIVar26->ScrollbarSizes).x = (pIVar4->DC).ItemWidth;
    (pIVar26->ScrollbarSizes).y = (float)(pIVar4->DC).ItemWidthStack.Size;
    fVar36 = 0.0;
    fVar38 = 0.0;
    if ((uVar13 >> 9 & 1) != 0) {
      fVar38 = 1.0;
    }
    (pIVar5->DC).CurrLineSize.x = 0.0;
    (pIVar5->DC).CurrLineSize.y = 0.0;
    (pIVar5->DC).PrevLineSize.x = 0.0;
    (pIVar5->DC).PrevLineSize.y = 0.0;
    if ((uVar13 & 0x800200) == 0) {
      fVar36 = (pIVar9->Style).CellPadding.x;
    }
    fVar37 = 0.0;
    fVar33 = 0.0;
    if ((uVar13 & 0x800200) == 0x200) {
      fVar33 = (pIVar9->Style).CellPadding.x;
    }
    p_00->CellSpacingX1 = fVar38 + fVar36;
    p_00->CellSpacingX2 = fVar36;
    p_00->CellPaddingX = fVar33;
    p_00->CellPaddingY = (pIVar9->Style).CellPadding.y;
    fVar36 = 0.0;
    if ((uVar13 >> 10 & 1) != 0) {
      fVar36 = 1.0;
    }
    if ((uVar13 >> 0x16 & 1) == 0 && (uVar13 & 0x200400) != 0) {
      fVar37 = (pIVar9->Style).CellPadding.x;
    }
    p_00->OuterPaddingX = (fVar36 + fVar37) - fVar33;
    p_00->CurrentRow = -1;
    p_00->CurrentColumn = -1;
    p_00->RowBgColorCounter = 0;
    *(uint *)&p_00->field_0x98 = (uint)*(ushort *)&p_00->field_0x98;
    pIVar22 = &pIVar5->ClipRect;
    if (pIVar5 == pIVar4) {
      pIVar22 = &p_00->WorkRect;
    }
    IVar34 = pIVar22->Max;
    (p_00->InnerClipRect).Min = pIVar22->Min;
    (p_00->InnerClipRect).Max = IVar34;
    fVar36 = (p_00->InnerClipRect).Min.x;
    fVar38 = (p_00->InnerClipRect).Min.y;
    fVar33 = (p_00->WorkRect).Min.x;
    fVar37 = (p_00->WorkRect).Min.y;
    uVar14 = -(uint)(fVar33 <= fVar36);
    IVar34.x = (float)(~uVar14 & (uint)fVar33 | (uint)fVar36 & uVar14);
    uVar14 = -(uint)(fVar37 <= fVar38);
    IVar34.y = (float)(~uVar14 & (uint)fVar37 | (uint)fVar38 & uVar14);
    (p_00->InnerClipRect).Min = IVar34;
    fVar38 = (p_00->InnerClipRect).Max.x;
    fVar36 = (p_00->WorkRect).Max.x;
    if (fVar36 <= fVar38) {
      fVar38 = fVar36;
    }
    fVar36 = (p_00->InnerClipRect).Max.y;
    fVar33 = (p_00->WorkRect).Max.y;
    if (fVar33 <= fVar36) {
      fVar36 = fVar33;
    }
    IVar35.y = fVar36;
    IVar35.x = fVar38;
    (p_00->InnerClipRect).Max = IVar35;
    ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
    if ((uVar13 >> 0x11 & 1) == 0) {
      fVar36 = (pIVar5->ClipRect).Max.y;
    }
    else {
      fVar36 = (p_00->InnerClipRect).Max.y;
      fVar38 = (pIVar5->WorkRect).Max.y;
      if (fVar38 <= fVar36) {
        fVar36 = fVar38;
      }
    }
    (p_00->InnerClipRect).Max.y = fVar36;
    fVar36 = (p_00->WorkRect).Min.y;
    p_00->RowPosY2 = fVar36;
    p_00->RowPosY1 = fVar36;
    p_00->RowTextBaseline = 0.0;
    p_00->FreezeRowsRequest = '\0';
    p_00->FreezeRowsCount = '\0';
    p_00->FreezeColumnsRequest = '\0';
    p_00->FreezeColumnsCount = '\0';
    p_00->IsUnfrozenRows = true;
    p_00->DeclColumnsCount = '\0';
    IVar15 = GetColorU32(0x2b,1.0);
    p_00->BorderColorStrong = IVar15;
    IVar15 = GetColorU32(0x2c,1.0);
    p_00->BorderColorLight = IVar15;
    pIVar9->CurrentTable = p_00;
    uVar14 = (uint)local_108;
    (pIVar4->DC).CurrentTableIdx = uVar14;
    if (pIVar5 != pIVar4) {
      (pIVar5->DC).CurrentTableIdx = uVar14;
    }
    if (((uVar21 & 2) != 0) && ((uVar13 & 2) == 0)) {
      p_00->IsResetDisplayOrderRequest = true;
    }
    local_f8 = pIVar5;
    if ((pIVar9->TablesLastTimeActive).Size <= (int)uVar14) {
      iVar12 = uVar14 + 1;
      iVar25 = (pIVar9->TablesLastTimeActive).Capacity;
      if (iVar25 <= (int)uVar14) {
        if (iVar25 == 0) {
          iVar30 = 8;
        }
        else {
          iVar30 = iVar25 / 2 + iVar25;
        }
        if (iVar30 <= iVar12) {
          iVar30 = iVar12;
        }
        if (iVar25 < iVar30) {
          __dest_00 = (float *)MemAlloc((long)iVar30 << 2);
          __src = (pIVar9->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            memcpy(__dest_00,__src,(long)(pIVar9->TablesLastTimeActive).Size << 2);
            MemFree((pIVar9->TablesLastTimeActive).Data);
          }
          (pIVar9->TablesLastTimeActive).Data = __dest_00;
          (pIVar9->TablesLastTimeActive).Capacity = iVar30;
          uVar14 = (uint)local_108;
        }
      }
      iVar25 = (pIVar9->TablesLastTimeActive).Size;
      lVar31 = (long)iVar25;
      if (iVar25 <= (int)uVar14) {
        do {
          (pIVar9->TablesLastTimeActive).Data[lVar31] = -1.0;
          lVar31 = lVar31 + 1;
        } while (iVar12 != lVar31);
      }
      (pIVar9->TablesLastTimeActive).Size = iVar12;
    }
    if ((-1 < (int)uVar14) && ((int)uVar14 < (pIVar9->TablesLastTimeActive).Size)) {
      dVar3 = pIVar9->Time;
      (pIVar9->TablesLastTimeActive).Data[uVar14] = (float)dVar3;
      *(float *)((long)&pIVar26->Name + 4) = (float)dVar3;
      p_00->MemoryCompacted = false;
      pIVar20 = (p_00->Columns).Data;
      iVar25 = (int)((long)(p_00->Columns).DataEnd - (long)pIVar20 >> 3) * -0x3b13b13b;
      if (iVar25 == columns_count || iVar25 == 0) {
        local_128 = (void *)0x0;
        pIVar20 = (ImGuiTableColumn *)0x0;
      }
      else {
        local_128 = p_00->RawData;
        p_00->RawData = (void *)0x0;
      }
      if (p_00->RawData == (void *)0x0) {
        TableBeginInitMemory(p_00,columns_count);
        p_00->IsSettingsRequestLoad = true;
        p_00->IsInitializing = true;
      }
      if (p_00->IsResetAllRequest == true) {
        p_00->IsInitializing = true;
        p_00->IsResetAllRequest = false;
        p_00->IsSettingsRequestLoad = false;
        p_00->IsSettingsDirty = true;
        p_00->SettingsLoadedFlags = 0;
      }
      if (p_00->IsInitializing == true) {
        p_00->SettingsOffset = -1;
        p_00->IsSortSpecsDirty = true;
        p_00->InstanceInteracted = -1;
        p_00->ContextPopupColumn = -1;
        p_00->ReorderColumn = -1;
        p_00->HoveredColumnBody = -1;
        p_00->HoveredColumnBorder = -1;
        p_00->AutoFitSingleColumn = -1;
        p_00->ResizedColumn = -1;
        p_00->LastResizedColumn = -1;
        if (0 < columns_count) {
          lVar31 = 0x60;
          uVar27 = 0;
          do {
            pIVar6 = (p_00->Columns).Data;
            pIVar18 = (ImGuiTableColumn *)((long)pIVar6 + lVar31 + -0x60);
            if ((p_00->Columns).DataEnd <= pIVar18) goto LAB_0018d748;
            if ((pIVar20 == (ImGuiTableColumn *)0x0) || ((long)iVar25 <= (long)uVar27)) {
              uVar2 = *(undefined4 *)((long)pIVar6 + lVar31 + -0x4c);
              uStack_98 = 0;
              local_b8._Channels.Data = (ImDrawChannel *)0x0;
              uStack_a0 = 0;
              uStack_9d = 0;
              local_b8._Current = 0;
              local_b8._Count = 0;
              local_b8._Channels.Size = 0;
              local_b8._Channels.Capacity = 0;
              local_c8.x = 0.0;
              local_c8.y = 0.0;
              uStack_c0 = 0;
              uStack_95 = 0xffffffffffffff00;
              pIVar18->Flags = 0;
              pIVar18->WidthGiven = 0.0;
              *(undefined8 *)((long)pIVar6 + lVar31 + -0x58) = 0;
              *(undefined8 *)((long)pIVar6 + lVar31 + -0x50) = 0xbf800000;
              *(undefined4 *)((long)pIVar6 + lVar31 + -0x48) = 0xbf800000;
              puVar1 = (undefined8 *)((long)pIVar6 + lVar31 + -0x44);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)pIVar6 + lVar31 + -0x34);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined1 (*) [16])((long)pIVar6 + lVar31 + -0x24) = ZEXT816(0) << 0x40;
              puVar1 = (undefined8 *)((long)pIVar6 + lVar31 + -0x19);
              *puVar1 = 0;
              puVar1[1] = 0xffffffffffffff00;
              *(undefined2 *)((long)pIVar6 + lVar31 + -9) = 0xffff;
              *(undefined1 *)((long)pIVar6 + lVar31 + -7) = 0xff;
              *(undefined8 *)((long)pIVar6 + lVar31 + -6) = 0;
              *(undefined4 *)((long)&pIVar6->Flags + lVar31 + 2) = 0;
              *(undefined4 *)((long)pIVar6 + lVar31 + -0x4c) = uVar2;
              *(undefined1 *)((long)&pIVar6->Flags + lVar31) = 1;
              *(undefined2 *)((long)pIVar6 + lVar31 + -6) = 0x101;
            }
            else {
              pIVar29 = (ImGuiTableColumnFlags *)((long)pIVar20 + lVar31 + -0x60);
              for (lVar28 = 0x19; lVar28 != 0; lVar28 = lVar28 + -1) {
                pIVar18->Flags = *pIVar29;
                pIVar29 = pIVar29 + (ulong)bVar32 * -2 + 1;
                pIVar18 = (ImGuiTableColumn *)((long)pIVar18 + (ulong)bVar32 * -8 + 4);
              }
              *(undefined2 *)((long)&pIVar6->WidthGiven + lVar31) =
                   *(undefined2 *)((long)&pIVar20->WidthGiven + lVar31);
            }
            pcVar19 = (p_00->DisplayOrderToIndex).Data + uVar27;
            if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar19) {
              pcVar19 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
              goto LAB_0018d774;
            }
            *pcVar19 = (char)uVar27;
            *(char *)((long)pIVar6 + lVar31 + -0xe) = (char)uVar27;
            uVar27 = uVar27 + 1;
            lVar31 = lVar31 + 0x68;
          } while (uVar23 != uVar27);
        }
      }
      if (local_128 != (void *)0x0) {
        MemFree(local_128);
      }
      if (p_00->IsSettingsRequestLoad == true) {
        TableLoadSettings(p_00);
      }
      fVar36 = pIVar9->FontSize;
      fVar38 = p_00->RefScale;
      if ((fVar38 != 0.0) || (NAN(fVar38))) {
        if (((fVar38 != fVar36) || (NAN(fVar38) || NAN(fVar36))) && (0 < columns_count)) {
          pIVar20 = (p_00->Columns).Data;
          do {
            if ((p_00->Columns).DataEnd <= pIVar20) {
LAB_0018d748:
              pcVar19 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0018d774:
              __assert_fail("p >= Data && p < DataEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                            ,0x23b,pcVar19);
            }
            pIVar20->WidthRequest = pIVar20->WidthRequest * (fVar36 / fVar38);
            pIVar20 = pIVar20 + 1;
            uVar23 = uVar23 - 1;
          } while (uVar23 != 0);
        }
      }
      p_00->RefScale = fVar36;
      local_f8->SkipItems = true;
      if (0 < (p_00->ColumnsNames).Buf.Size) {
        iVar25 = (p_00->ColumnsNames).Buf.Capacity;
        if (iVar25 < 0) {
          uVar21 = iVar25 / 2 + iVar25;
          size = 0;
          if (0 < (int)uVar21) {
            size = (size_t)uVar21;
          }
          __dest_01 = (char *)MemAlloc(size);
          pcVar19 = (p_00->ColumnsNames).Buf.Data;
          if (pcVar19 != (char *)0x0) {
            memcpy(__dest_01,pcVar19,(long)(p_00->ColumnsNames).Buf.Size);
            MemFree((p_00->ColumnsNames).Buf.Data);
          }
          (p_00->ColumnsNames).Buf.Data = __dest_01;
          (p_00->ColumnsNames).Buf.Capacity = (int)size;
        }
        (p_00->ColumnsNames).Buf.Size = 0;
      }
      TableBeginApplyRequests(p_00);
      return true;
    }
    pcVar19 = "T &ImVector<float>::operator[](int) [T = float]";
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,pcVar19);
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStackIdx++;
    if (g.CurrentTableStackIdx + 1 > g.TablesTempDataStack.Size)
        g.TablesTempDataStack.resize(g.CurrentTableStackIdx + 1, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempDataStack[g.CurrentTableStackIdx];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}